

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O1

HighsInt __thiscall
HighsDomain::propagateRowLower
          (HighsDomain *this,HighsInt *Rindex,double *Rvalue,HighsInt Rlen,double Rlower,
          HighsCDouble *maxactivity,HighsInt ninfmax,HighsDomainChange *boundchgs)

{
  double *pdVar1;
  double dVar2;
  HighsInt HVar3;
  HighsCDouble boundVal;
  HighsCDouble boundVal_00;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  HighsInt local_54;
  HighsCDouble local_50;
  double local_40;
  ulong local_38;
  
  local_54 = 0;
  if (Rlen != 0 && ninfmax < 2) {
    local_38 = (ulong)(uint)Rlen;
    uVar5 = 0;
    local_54 = 0;
    local_40 = Rlower;
    do {
      dVar9 = Rvalue[uVar5];
      if (0.0 <= dVar9) {
        dVar8 = (this->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[Rindex[uVar5]];
        bVar6 = dVar8 < INFINITY;
      }
      else {
        dVar8 = (this->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[Rindex[uVar5]];
        bVar6 = -INFINITY < dVar8;
      }
      dVar7 = INFINITY;
      if (bVar6) {
        dVar7 = dVar8 * dVar9;
      }
      if (ninfmax == 1) {
        if (INFINITY <= dVar7) {
          dVar8 = maxactivity->hi;
          local_50.lo = maxactivity->lo;
          goto LAB_002992f0;
        }
      }
      else {
        dVar2 = maxactivity->hi;
        dVar8 = dVar2 - dVar7;
        local_50.lo = (-dVar7 - (dVar8 - dVar2)) + (dVar2 - (dVar8 - (dVar8 - dVar2))) +
                      maxactivity->lo;
LAB_002992f0:
        dVar7 = local_40 - dVar8;
        local_50.hi._0_1_ = SUB81(dVar7,0);
        local_50.hi._1_7_ = (undefined7)((ulong)dVar7 >> 8);
        local_50.lo = ((local_40 - (dVar8 + dVar7)) + (-dVar8 - (dVar7 - (dVar8 + dVar7)))) -
                      local_50.lo;
        HighsCDouble::operator/=(&local_50,dVar9);
        boundVal_00.hi._1_7_ = local_50.hi._1_7_;
        boundVal_00.hi._0_1_ = local_50.hi._0_1_;
        boundVal_00.lo = local_50.lo;
        boundVal.hi._1_7_ = local_50.hi._1_7_;
        boundVal.hi._0_1_ = local_50.hi._0_1_;
        boundVal.lo = local_50.lo;
        dVar9 = ABS(((double)CONCAT71(local_50.hi._1_7_,local_50.hi._0_1_) + local_50.lo) * 1e-14);
        pdVar1 = &((this->mipsolver->mipdata_)._M_t.
                   super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                   .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol;
        if (dVar9 < *pdVar1 || dVar9 == *pdVar1) {
          if (0.0 < Rvalue[uVar5] || Rvalue[uVar5] == 0.0) {
            dVar9 = adjustedLb(this,Rindex[uVar5],boundVal_00,(bool *)&local_50);
            if (local_50.hi._0_1_ == '\x01') {
              HVar3 = Rindex[uVar5];
              lVar4 = (long)local_54;
              local_54 = local_54 + 1;
              boundchgs[lVar4].boundval = dVar9;
              boundchgs[lVar4].column = HVar3;
              boundchgs[lVar4].boundtype = kLower;
            }
          }
          else {
            dVar9 = adjustedUb(this,Rindex[uVar5],boundVal,(bool *)&local_50);
            if (local_50.hi._0_1_ == '\x01') {
              HVar3 = Rindex[uVar5];
              lVar4 = (long)local_54;
              local_54 = local_54 + 1;
              boundchgs[lVar4].boundval = dVar9;
              boundchgs[lVar4].column = HVar3;
              boundchgs[lVar4].boundtype = kUpper;
            }
          }
        }
      }
      uVar5 = uVar5 + 1;
    } while (local_38 != uVar5);
  }
  return local_54;
}

Assistant:

HighsInt HighsDomain::propagateRowLower(const HighsInt* Rindex,
                                        const double* Rvalue, HighsInt Rlen,
                                        double Rlower,
                                        const HighsCDouble& maxactivity,
                                        HighsInt ninfmax,
                                        HighsDomainChange* boundchgs) {
  assert(std::isfinite(double(maxactivity)));
  if (ninfmax > 1) return 0;
  HighsInt numchgs = 0;
  for (HighsInt i = 0; i != Rlen; ++i) {
    HighsCDouble maxresact;
    double actcontribution = activityContributionMax(
        Rvalue[i], col_lower_[Rindex[i]], col_upper_[Rindex[i]]);
    if (ninfmax == 1) {
      if (actcontribution != kHighsInf) continue;

      maxresact = maxactivity;
    } else {
      maxresact = maxactivity - actcontribution;
    }

    HighsCDouble boundVal = (Rlower - maxresact) / Rvalue[i];
    if (std::fabs(double(boundVal) * kHighsTiny) > mipsolver->mipdata_->feastol)
      continue;

    if (Rvalue[i] < 0) {
      bool accept;

      double bound = adjustedUb(Rindex[i], boundVal, accept);
      if (accept)
        boundchgs[numchgs++] = {bound, Rindex[i], HighsBoundType::kUpper};
    } else {
      bool accept;

      double bound = adjustedLb(Rindex[i], boundVal, accept);
      if (accept)
        boundchgs[numchgs++] = {bound, Rindex[i], HighsBoundType::kLower};
    }
  }

  return numchgs;
}